

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memstate.hh
# Opt level: O0

void __thiscall MemoryImage::insert(MemoryImage *this,uintb addr,uintb val)

{
  LowlevelError *this_00;
  allocator local_41;
  string local_40 [32];
  uintb local_20;
  uintb val_local;
  uintb addr_local;
  MemoryImage *this_local;
  
  local_20 = val;
  val_local = addr;
  addr_local = (uintb)this;
  this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,"Writing to read-only MemoryBank",&local_41);
  LowlevelError::LowlevelError(this_00,(string *)local_40);
  __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
}

Assistant:

virtual void insert(uintb addr,uintb val) {
    throw LowlevelError("Writing to read-only MemoryBank"); }